

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load_alist.c
# Opt level: O1

mod2sparse * load_alist(char *alist_file)

{
  int iVar1;
  int iVar2;
  FILE *__stream;
  int *piVar3;
  mod2entry *pmVar4;
  int iVar5;
  long lVar6;
  int nxt;
  int N;
  int M;
  int mxcw;
  int mxrw;
  int local_5c;
  uint local_58;
  uint local_54;
  mod2sparse *local_50;
  int *local_48;
  int *local_40;
  int local_38;
  int local_34;
  
  __stream = (FILE *)open_file_std(alist_file,"r");
  if (__stream == (FILE *)0x0) goto LAB_001217bd;
  iVar1 = __isoc99_fscanf(__stream,"%d",&local_54);
  if ((((iVar1 != 1) || ((int)local_54 < 1)) ||
      (iVar1 = __isoc99_fscanf(__stream,"%d",&local_58), iVar1 != 1)) ||
     ((((((int)local_58 < 1 || (iVar1 = __isoc99_fscanf(__stream,"%d",&local_34), iVar1 != 1)) ||
        ((local_34 < 0 ||
         (((int)local_58 < local_34 ||
          (iVar1 = __isoc99_fscanf(__stream,"%d",&local_38), iVar1 != 1)))))) || (local_38 < 0)) ||
      ((int)local_54 < local_38)))) goto LAB_001217b3;
  piVar3 = (int *)chk_alloc(local_54,4);
  local_40 = piVar3;
  if (0 < (int)local_54) {
    lVar6 = 0;
    do {
      iVar1 = __isoc99_fscanf(__stream,"%d",piVar3);
      if (((iVar1 != 1) || (*piVar3 < 0)) || ((int)local_58 < *piVar3)) goto LAB_001217a9;
      lVar6 = lVar6 + 1;
      piVar3 = piVar3 + 1;
    } while (lVar6 < (int)local_54);
  }
  piVar3 = (int *)chk_alloc(local_58,4);
  local_48 = piVar3;
  if (0 < (int)local_58) {
    lVar6 = 0;
    do {
      iVar1 = __isoc99_fscanf(__stream,"%d",piVar3);
      if (((iVar1 != 1) || (*piVar3 < 0)) || ((int)local_54 < *piVar3)) goto LAB_001217ae;
      lVar6 = lVar6 + 1;
      piVar3 = piVar3 + 1;
    } while (lVar6 < (int)local_58);
  }
  local_50 = mod2sparse_allocate(local_54,local_58);
  do {
    iVar1 = __isoc99_fscanf(__stream,"%d",&local_5c);
    if (iVar1 != 1) {
      local_5c = -1;
    }
  } while (local_5c == 0);
  if ((int)local_54 < 1) {
    iVar1 = 0;
  }
  else {
    lVar6 = 0;
    iVar1 = 0;
    do {
      if (0 < local_40[lVar6]) {
        iVar5 = 0;
        do {
          if ((local_5c < 1) || ((int)local_58 < local_5c)) {
LAB_0012179f:
            load_alist_cold_3();
            goto LAB_001217a4;
          }
          pmVar4 = mod2sparse_find(local_50,(int)lVar6,local_5c + -1);
          if (pmVar4 != (mod2entry *)0x0) goto LAB_0012179f;
          mod2sparse_insert(local_50,(int)lVar6,local_5c + -1);
          do {
            iVar2 = __isoc99_fscanf(__stream,"%d",&local_5c);
            if (iVar2 != 1) {
              local_5c = -1;
            }
          } while (local_5c == 0);
          iVar1 = iVar1 + 1;
          iVar5 = iVar5 + 1;
        } while (iVar5 < local_40[lVar6]);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < (int)local_54);
  }
  if (0 < (int)local_58) {
    lVar6 = 0;
    do {
      if (0 < local_48[lVar6]) {
        iVar5 = 0;
        do {
          if (((local_5c < 1) || ((int)local_54 < local_5c)) ||
             (pmVar4 = mod2sparse_find(local_50,local_5c + -1,(int)lVar6),
             pmVar4 == (mod2entry *)0x0)) goto LAB_001217a4;
          do {
            iVar2 = __isoc99_fscanf(__stream,"%d",&local_5c);
            if (iVar2 != 1) {
              local_5c = -1;
            }
          } while (local_5c == 0);
          iVar1 = iVar1 + -1;
          iVar5 = iVar5 + 1;
        } while (iVar5 < local_48[lVar6]);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < (int)local_58);
  }
  if (((iVar1 == 0) && (local_5c == -1)) && (iVar1 = feof(__stream), iVar1 != 0)) {
    return local_50;
  }
  goto LAB_001217b8;
LAB_001217a4:
  load_alist_cold_2();
LAB_001217a9:
  load_alist_cold_5();
LAB_001217ae:
  load_alist_cold_4();
LAB_001217b3:
  load_alist_cold_6();
LAB_001217b8:
  load_alist_cold_1();
LAB_001217bd:
  load_alist_cold_7();
  fwrite("Alist file doesn\'t have the right format\n",0x29,1,_stderr);
  exit(1);
}

Assistant:

mod2sparse *load_alist
(char *alist_file)
{
  FILE *af;

  mod2sparse *H;

  int mxrw, mxcw;
  int *rw, *cw;
  int i, j, k;
  int tot, trans;
  int nxt;
  int M,N;

  af = open_file_std(alist_file,"r");

  if (af==NULL) 
  { fprintf(stderr,"Can't open alist file: %s\n",alist_file);
    exit(1);
  }

  if (fscanf(af,"%d",&M)!=1 || M<1
   || fscanf(af,"%d",&N)!=1 || N<1
   || fscanf(af,"%d",&mxrw)!=1 || mxrw<0 || mxrw>N 
   || fscanf(af,"%d",&mxcw)!=1 || mxcw<0 || mxcw>M)
  { bad_alist_file();
  }

  rw = (int *) chk_alloc (M, sizeof *rw);

  for (i = 0; i<M; i++)
  { if (fscanf(af,"%d",&rw[i])!=1 || rw[i]<0 || rw[i]>N)
    { bad_alist_file();
    }
  }

  cw = (int *) chk_alloc (N, sizeof *cw);

  for (j = 0; j<N; j++)
  { if (fscanf(af,"%d",&cw[j])!=1 || cw[j]<0 || cw[j]>M)
    { bad_alist_file();
    }
  }

   H = mod2sparse_allocate(M,N);

  do { if (fscanf(af,"%d",&nxt)!=1) nxt = -1; } while (nxt==0);
      
  tot = 0;

  for (i = 0; i<M; i++)
  { for (k = 0; k<rw[i]; k++)
    { if (nxt<=0 || nxt>N || mod2sparse_find(H,i,nxt-1))
      { bad_alist_file();
      }
      mod2sparse_insert(H,i,nxt-1);
      tot += 1;
      do { if (fscanf(af,"%d",&nxt)!=1) nxt = -1; } while (nxt==0);
    }
  }

  for (j = 0; j<N; j++)
  { for (k = 0; k<cw[j]; k++)
    { if (nxt<=0 || nxt>M || !mod2sparse_find(H,nxt-1,j))
      { bad_alist_file();
      }
      tot -= 1;
      do { if (fscanf(af,"%d",&nxt)!=1) nxt = -1; } while (nxt==0);
    }
  }

  if (tot!=0 || nxt!=-1 || !feof(af))
  { bad_alist_file();
  }

  return H;
}